

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Gym_File::track_info_(Gym_File *this,track_info_t *out,int param_3)

{
  track_info_t *out_00;
  undefined4 in_EDX;
  header_t *in_RSI;
  long in_RDI;
  long length;
  undefined4 in_stack_ffffffffffffffe8;
  
  out_00 = (track_info_t *)
           gym_track_length((byte_ *)(*(long *)(in_RDI + 0x1a0) + (long)*(int *)(in_RDI + 0x1b0)),
                            *(byte_ **)(in_RDI + 0x1a8));
  get_gym_info(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8),out_00);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t track_info_( track_info_t* out, int ) const
	{
		long length = gym_track_length( &file_begin [data_offset], file_end );
		get_gym_info( *(Gym_Emu::header_t const*) file_begin, length, out );
		return 0;
	}